

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O3

uint32 __thiscall
Clasp::Asp::RuleTransform::Impl::transform
          (Impl *this,Atom_t head,weight_t bound,WeightLitSpan *wlits,Strategy s)

{
  pointer pWVar1;
  pointer plVar2;
  size_t sVar3;
  uint32 uVar4;
  WeightLit_t *pWVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  pair<Potassco::WeightLit_t_*,_long> pVar12;
  Atom_t local_5c;
  AtomSpan local_58;
  LitSpan local_48;
  
  this->bound_ = bound;
  local_58.first = (uint *)wlits->first;
  sVar3 = wlits->size;
  (this->agg_).ebo_.size = 0;
  bk_lib::pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>::
  insert_impl<unsigned_int,bk_lib::detail::Memcpy<Potassco::WeightLit_t>>
            ((pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>> *)&this->agg_,
             (this->agg_).ebo_.buf,(uint)sVar3,(Memcpy<Potassco::WeightLit_t> *)&local_58);
  uVar7 = (this->agg_).ebo_.size;
  uVar8 = (ulong)uVar7;
  if (1 < uVar8) {
    pWVar1 = (this->agg_).ebo_.buf;
    lVar6 = 8;
    do {
      if (*(int *)((long)pWVar1 + lVar6 + -4) < *(int *)((long)&pWVar1->weight + lVar6)) {
        pVar12 = std::get_temporary_buffer<Potassco::WeightLit_t>(uVar8 + 1 >> 1);
        pWVar5 = pVar12.first;
        if (pWVar5 == (WeightLit_t *)0x0) {
          std::
          __inplace_stable_sort<Potassco::WeightLit_t*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::Asp::RuleTransform::Impl::CmpW>>
                    (pWVar1,pWVar1 + uVar8);
        }
        else {
          std::
          __stable_sort_adaptive<Potassco::WeightLit_t*,Potassco::WeightLit_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::Asp::RuleTransform::Impl::CmpW>>
                    (pWVar1,pWVar1 + uVar8,pWVar5);
        }
        operator_delete(pWVar5);
        uVar7 = (this->agg_).ebo_.size;
        break;
      }
      lVar6 = lVar6 + 8;
    } while (uVar8 * 8 - lVar6 != 0);
  }
  local_58.first = (uint *)0x0;
  bk_lib::pod_vector<long,_std::allocator<long>_>::resize(&this->sumR_,uVar7,(long *)&local_58);
  uVar7 = (this->agg_).ebo_.size;
  uVar10 = (ulong)uVar7;
  pWVar1 = (this->agg_).ebo_.buf;
  plVar2 = (this->sumR_).ebo_.buf;
  lVar6 = 0;
  uVar8 = uVar10;
  do {
    bVar11 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar11) {
      iVar9 = this->bound_;
      uVar4 = 0;
      if (iVar9 <= lVar6) {
        if (iVar9 < 1) {
          local_48.first = (pointer)0x0;
          local_48.size = 0;
        }
        else {
          if ((long)iVar9 <= lVar6 - pWVar1[uVar7 - 1].weight) {
            if ((s != strategy_no_aux) && ((s != strategy_default || (5 < lVar6)))) {
              uVar4 = transformSplit(this,head);
              return uVar4;
            }
            uVar4 = transformSelect(this,head);
            return uVar4;
          }
          (this->lits_).ebo_.size = 0;
          if (uVar10 == 0) {
            local_48.size = 0;
            local_48.first = (pointer)0x0;
          }
          else {
            lVar6 = 0;
            do {
              local_58.first =
                   (uint *)CONCAT44(local_58.first._4_4_,*(undefined4 *)((long)&pWVar1->lit + lVar6)
                                   );
              bk_lib::pod_vector<int,_std::allocator<int>_>::push_back
                        (&this->lits_,(int *)&local_58);
              lVar6 = lVar6 + 8;
            } while (uVar10 << 3 != lVar6);
            uVar7 = (this->lits_).ebo_.size;
            local_48.size = (size_t)uVar7;
            if (uVar7 == 0) {
              local_48.first = (pointer)0x0;
            }
            else {
              local_48.first = (this->lits_).ebo_.buf;
            }
          }
        }
        local_58.first = &local_5c;
        local_58.size = (size_t)(head != 0);
        local_5c = head;
        uVar4 = addRule(this,(Head_t)0x0,&local_58,&local_48);
      }
      return uVar4;
    }
    iVar9 = pWVar1[uVar8].weight;
    if (this->bound_ < pWVar1[uVar8].weight) {
      iVar9 = this->bound_;
    }
    pWVar1[uVar8].weight = iVar9;
    lVar6 = lVar6 + iVar9;
    plVar2[uVar8] = lVar6;
  } while ((-1 < iVar9) && (lVar6 < 0x80000000));
  Potassco::fail(-2,
                 "uint32 Clasp::Asp::RuleTransform::Impl::transform(Atom_t, weight_t, const Potassco::WeightLitSpan &, Strategy)"
                 ,0xb7,"agg_[i].weight >= 0 && sum <= ( 2147483647)","invalid weight rule",0);
}

Assistant:

uint32 RuleTransform::Impl::transform(Atom_t head, weight_t bound, const Potassco::WeightLitSpan& wlits, Strategy s) {
	bound_ = bound;
	agg_.assign(begin(wlits), end(wlits));
	if (!isSorted(agg_.begin(), agg_.end(), CmpW())) {
		std::stable_sort(agg_.begin(), agg_.end(), CmpW());
	}
	wsum_t sum = 0;
	sumR_.resize(agg_.size());
	for (WLitVec::size_type i = agg_.size(); i--;) {
		agg_[i].weight = std::min(agg_[i].weight, bound_);
		sumR_[i] = (sum += agg_[i].weight);
		POTASSCO_REQUIRE(agg_[i].weight >= 0 && sum <= CLASP_WEIGHT_T_MAX, "invalid weight rule");
	}
	if      (bound_ > sum) { return 0; }
	else if (bound_ <= 0)  { return addRule(head, Potassco::toSpan<Potassco::Lit_t>()); }
	else if ((sum - agg_.back().weight) < bound_) { // normal rule
		lits_.clear();
		for (WLitVec::const_iterator it = agg_.begin(), end = agg_.end(); it != end; ++it) {
			lits_.push_back(lit(*it));
		}
		return addRule(head, Potassco::toSpan(lits_));
	}
	else {
		return ((s == strategy_no_aux || (sum < 6 && s == strategy_default))
			? transformSelect(head)
			: transformSplit(head));
	}
}